

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pmaxsh_mips(uint64_t fs,uint64_t ft)

{
  short sVar1;
  long lVar2;
  short sVar3;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    sVar1 = *(short *)((long)&vs + lVar2 * 2);
    sVar3 = *(short *)((long)&vt + lVar2 * 2);
    if (sVar3 < sVar1) {
      sVar3 = sVar1;
    }
    *(short *)((long)&vs + lVar2 * 2) = sVar3;
  }
  return vs.d;
}

Assistant:

uint64_t helper_pmaxsh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.sh[i] = (vs.sh[i] >= vt.sh[i] ? vs.sh[i] : vt.sh[i]);
    }
    return vs.d;
}